

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_test.cc
# Opt level: O0

void __thiscall CNNTest_TestMultithreading_Test::TestBody(CNNTest_TestMultithreading_Test *this)

{
  int i_1;
  int i;
  AVxWorker workers [4];
  AVxWorkerInterface *winterface;
  CNN_THREAD_DATA thread_data;
  CNN_CONFIG cnn_config;
  float expected [16];
  float bias [4];
  float weights [36];
  float input [4];
  int filter_width;
  int filter_height;
  int image_width;
  int image_height;
  undefined1 *local_20c0;
  int local_20b4;
  undefined4 uStackY_20ac;
  int local_209c;
  AVxWorker local_2098 [4];
  AVxWorkerInterface *local_1fb0;
  undefined8 local_1fa8;
  AVxWorker *local_1fa0;
  undefined4 local_1f98 [6];
  undefined4 local_1f80;
  undefined4 local_1f7c;
  undefined4 local_1f78;
  undefined4 local_1f74;
  undefined4 local_1f70;
  undefined4 local_1f6c;
  undefined1 *local_1f60;
  undefined8 *local_1f58;
  undefined1 local_1f50;
  undefined1 local_1f4f;
  undefined1 local_1f44;
  undefined1 local_1f43;
  undefined1 auStackY_1f08 [1776];
  double in_stack_ffffffffffffe7e8;
  int in_stack_ffffffffffffe7f4;
  CNN_CONFIG *in_stack_ffffffffffffe7f8;
  float *in_stack_ffffffffffffe800;
  float *in_stack_ffffffffffffe808;
  int in_stack_ffffffffffffe810;
  int in_stack_ffffffffffffe814;
  CNN_THREAD_DATA *in_stack_ffffffffffffe820;
  undefined1 local_108 [64];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [144];
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 2;
  local_10 = 2;
  local_14 = 3;
  local_18 = 3;
  local_28 = 0x40800000c0000000;
  local_20 = 0x3f800000;
  memcpy(local_b8,&DAT_018aa1a0,0x90);
  local_c8 = 0xc0400000c0800000;
  local_c0 = 0x40400000c0000000;
  memcpy(local_108,&DAT_018aa230,0x40);
  memset(local_1f98,0,0x1e90);
  local_1f98[0] = 1;
  local_1f80 = 1;
  local_1f7c = local_18;
  local_1f78 = local_14;
  local_1f74 = 4;
  local_1f70 = 1;
  local_1f6c = 1;
  local_1f60 = local_b8;
  local_1f58 = &local_c8;
  local_1f50 = 0;
  local_1f4f = 0;
  local_1f44 = 0;
  local_1f43 = 0;
  local_20c0 = auStackY_1f08;
  do {
    local_20c0 = local_20c0 + 0x78;
  } while (local_20c0 != local_108);
  local_1fa8 = 1;
  local_1fa0 = (AVxWorker *)0x0;
  anon_unknown.dwarf_30f402::CNNTest::RunCNNTest
            (in_stack_ffffffffffffe814,in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,
             in_stack_ffffffffffffe800,in_stack_ffffffffffffe7f8,in_stack_ffffffffffffe7f4,
             in_stack_ffffffffffffe820,in_stack_ffffffffffffe7e8);
  local_1fb0 = aom_get_worker_interface();
  for (local_209c = 0; local_209c < 4; local_209c = local_209c + 1) {
    (*local_1fb0->init)(local_2098 + local_209c);
  }
  local_1fa0 = local_2098;
  local_1fa8 = CONCAT44(uStackY_20ac,4);
  anon_unknown.dwarf_30f402::CNNTest::RunCNNTest
            (in_stack_ffffffffffffe814,in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,
             in_stack_ffffffffffffe800,in_stack_ffffffffffffe7f8,in_stack_ffffffffffffe7f4,
             in_stack_ffffffffffffe820,in_stack_ffffffffffffe7e8);
  for (local_20b4 = 0; local_20b4 < 4; local_20b4 = local_20b4 + 1) {
    (*local_1fb0->end)(local_2098 + local_20b4);
  }
  return;
}

Assistant:

TEST_F(CNNTest, TestMultithreading) {
  int image_height = 2;
  int image_width = 2;
  int filter_height = 3;
  int filter_width = 3;

  float input[] = {
    -2,
    4,
    1,
    0,
  };

  float weights[] = {
    -4, 2, -2, 0,  -4, 4, -3, -3, -3, -1, 1,  0,  -5, -3, 0, -5, 0, 0,
    -1, 0, 2,  -5, 0,  1, 4,  2,  1,  0,  -2, -1, -5, -3, 2, -2, 1, -5,
  };

  float bias[] = {
    -4,
    -3,
    -2,
    3,
  };

  float expected[] = {
    2, 10, -8, -17, -24, 5, -15, 6, -5, -5, 7, -10, 4, 13, 9, -14,
  };

  CNN_CONFIG cnn_config = {
    1,
    0,
    0,
    0,
    0,
    {
        {
            1,
            filter_width,
            filter_height,
            4,
            1,
            1,
            0,
            weights,
            bias,
            PADDING_SAME_ZERO,
            NONE,
            0,
            0,
            BRANCH_NO_COPY,
            BRANCH_NOC,
            {},
            {},
            0,
        },
    },
  };

  CNN_THREAD_DATA thread_data = { 1, nullptr };

  RunCNNTest(image_width, image_height, input, expected, &cnn_config,
             image_width, &thread_data, MSE_FLOAT_TOL);

  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  AVxWorker workers[4];

  for (int i = 0; i < 4; ++i) {
    winterface->init(&workers[i]);
  }

  thread_data = { 4, workers };

  RunCNNTest(image_width, image_height, input, expected, &cnn_config,
             image_width, &thread_data, MSE_FLOAT_TOL);

  for (int i = 0; i < 4; ++i) {
    winterface->end(&workers[i]);
  }
}